

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_http.c
# Opt level: O0

void bad_request(int client)

{
  int iVar1;
  char *pcStack_18;
  int bytes;
  char *buffer;
  int client_local;
  
  pcStack_18 = (char *)0x0;
  buffer._4_4_ = client;
  iVar1 = asprintf(&stack0xffffffffffffffe8,"HTTP/1.0 400 BAD REQUEST\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"Content-type: text/html\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"<P>Your browser sent a bad request, ");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  iVar1 = asprintf(&stack0xffffffffffffffe8,"such as a POST without a Content-Length.\r\n");
  send_free(buffer._4_4_,&stack0xffffffffffffffe8,iVar1);
  return;
}

Assistant:

void bad_request(int client) {
    char *buffer = NULL;

    int bytes = asprintf(&buffer, "HTTP/1.0 400 BAD REQUEST\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "Content-type: text/html\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "\r\n");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "<P>Your browser sent a bad request, ");
    send_free(client, &buffer, bytes);;

    bytes = asprintf(&buffer, "such as a POST without a Content-Length.\r\n");
    send_free(client, &buffer, bytes);;
}